

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall rw::Image::convertTo32(Image *this)

{
  uint uVar1;
  int iVar2;
  uint8 *puVar3;
  long lVar4;
  uint8 *puVar5;
  void *__ptr;
  uint8 *puVar6;
  uint8 *puVar7;
  int iVar8;
  code *pcVar9;
  uint8 *puVar10;
  int local_48;
  
  uVar1 = this->depth << 0x1e | this->depth - 4U >> 2;
  if (uVar1 < 2) {
    unpalettize(this,true);
    return;
  }
  puVar7 = this->pixels;
  if (uVar1 == 3) {
    pcVar9 = conv_RGBA8888_from_ARGB1555;
  }
  else {
    if (uVar1 != 5) {
      return;
    }
    pcVar9 = conv_RGBA8888_from_RGB888;
  }
  lVar4 = (long)this->width * 4;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 650"
  ;
  __ptr = (void *)0x30018;
  puVar3 = (uint8 *)(*DAT_00149de8)(this->height * lVar4);
  iVar8 = this->height;
  local_48 = (int)lVar4;
  if (0 < iVar8) {
    iVar2 = this->width;
    __ptr = (void *)0x0;
    puVar5 = puVar3;
    do {
      if (0 < iVar2) {
        iVar8 = 0;
        puVar6 = puVar7;
        puVar10 = puVar5;
        do {
          (*pcVar9)(puVar10,puVar6);
          puVar6 = puVar6 + this->bpp;
          puVar10 = puVar10 + 4;
          iVar8 = iVar8 + 1;
          iVar2 = this->width;
        } while (iVar8 < iVar2);
        iVar8 = this->height;
      }
      puVar7 = puVar7 + this->stride;
      puVar5 = puVar5 + local_48;
      uVar1 = (int)__ptr + 1;
      __ptr = (void *)(ulong)uVar1;
    } while ((int)uVar1 < iVar8);
  }
  free(this,__ptr);
  this->depth = 0x20;
  this->bpp = 4;
  this->stride = local_48;
  this->palette = (uint8 *)0x0;
  this->pixels = puVar3;
  *(byte *)&this->flags = (byte)this->flags | 1;
  return;
}

Assistant:

void
Image::convertTo32(void)
{
	assert(this->pixels);
	uint8 *pixels = this->pixels;
	int32 newstride = this->width*4;
	uint8 *newpixels;

	void (*fun)(uint8 *out, uint8 *in) = nil;
	switch(this->depth){
	case 4:
	case 8:
		assert(this->palette);
		this->unpalettize(true);
		return;
	case 16:
		fun = conv_RGBA8888_from_ARGB1555;
		break;
	case 24:
		fun = conv_RGBA8888_from_RGB888;
		break;
	default:
		return;
	}

	newpixels = rwNewT(uint8, newstride*this->height, MEMDUR_EVENT | ID_IMAGE);
	uint8 *pixels32 = newpixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		uint8 *newline = newpixels;
		for(int x = 0; x < this->width; x++){
			fun(newline, line);
			line += this->bpp;
			newline += 4;
		}
		pixels += this->stride;
		newpixels += newstride;
	}

	this->free();
	this->depth = 32;
	this->bpp = 4;
	this->stride = newstride;
	this->pixels = nil;
	this->palette = nil;
	this->setPixels(pixels32);
}